

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O3

void __thiscall TestSuite::doTest(TestSuite *this,string *test_name,test_func *func)

{
  int result;
  long lVar1;
  string *psVar2;
  
  if ((this->filter)._M_string_length != 0) {
    lVar1 = std::__cxx11::string::find((char *)test_name,(ulong)(this->filter)._M_dataplus._M_p,0);
    if (lVar1 == -1) {
      return;
    }
  }
  readyTest(this,test_name);
  psVar2 = getResMsg_abi_cxx11_();
  std::__cxx11::string::_M_replace((ulong)psVar2,0,(char *)psVar2->_M_string_length,0x10a36b);
  psVar2 = getInfoMsg_abi_cxx11_();
  std::__cxx11::string::_M_replace((ulong)psVar2,0,(char *)psVar2->_M_string_length,0x10a36b);
  getCurTest()::cur_test = this;
  if ((func->super__Function_base)._M_manager != (_Manager_type)0x0) {
    result = (*func->_M_invoker)((_Any_data *)func);
    reportTestResult(this,test_name,result);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void doTest( const std::string& test_name,
                 test_func func )
    {
        if (!matchFilter(test_name)) return;

        readyTest(test_name);
        TestSuite::getResMsg() = "";
        TestSuite::getInfoMsg() = "";
        TestSuite::getCurTest() = this;
        int ret = func();
        reportTestResult(test_name, ret);
    }